

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_automatic_builtin_output_location(CompilerMSL *this,BuiltIn builtin)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_38;
  BuiltIn local_2c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  const_iterator itr;
  BuiltIn builtin_local;
  CompilerMSL *this_local;
  
  local_2c = builtin;
  itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
       builtin;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(&this->builtin_to_automatic_output_location,&local_2c);
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(&this->builtin_to_automatic_output_location);
  bVar1 = ::std::__detail::operator==(&local_28,&local_38);
  if (bVar1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    pvVar2 = ::std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                         *)&local_28);
    this_local._4_4_ = pvVar2->second;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_automatic_builtin_output_location(spv::BuiltIn builtin) const
{
	auto itr = builtin_to_automatic_output_location.find(builtin);
	if (itr == builtin_to_automatic_output_location.end())
		return k_unknown_location;
	else
		return itr->second;
}